

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O3

int * __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::get_payload
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *this,
          int *key)

{
  longlong *plVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  uint uVar5;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *pAVar6;
  int *piVar7;
  long lVar8;
  self_type *unaff_RBX;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *this_00;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  undefined8 in_XMM0_Qa;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  plVar1 = &(this->stats_).num_lookups;
  *plVar1 = *plVar1 + 1;
  pAVar6 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *
           )this->root_node_;
  this_00 = pAVar6;
  if ((pAVar6->super_AlexNode<int,_int>).is_leaf_ == false) {
    iVar4 = *key;
    auVar13._8_8_ = 0x7fffffffffffffff;
    auVar13._0_8_ = 0x7fffffffffffffff;
    lVar8 = (this->stats_).num_node_lookups;
    auVar12._0_8_ = (double)iVar4;
    auVar12._8_8_ = in_XMM0_Qa;
    do {
      auVar15._8_8_ = 0;
      auVar15._0_8_ = (pAVar6->super_AlexNode<int,_int>).model_.a_;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (pAVar6->super_AlexNode<int,_int>).model_.b_;
      auVar2 = vfmadd213sd_fma(auVar15,auVar12,auVar2);
      uVar5 = *(int *)&pAVar6->allocator_ - 1;
      dVar14 = auVar2._0_8_;
      uVar9 = ~((int)dVar14 >> 0x1f) & (int)dVar14;
      if ((int)uVar9 <= (int)uVar5) {
        uVar5 = uVar9;
      }
      pAVar6 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                *)(&(pAVar6->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[(int)uVar5];
      bVar3 = (pAVar6->super_AlexNode<int,_int>).is_leaf_;
      if (bVar3 == true) {
        lVar8 = lVar8 + (pAVar6->super_AlexNode<int,_int>).level_;
        auVar15 = vcvtdq2pd_avx(ZEXT416((uint)(int)(dVar14 + 0.5)));
        (this->stats_).num_node_lookups = lVar8;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = dVar14 - auVar15._0_8_;
        auVar2 = vandpd_avx(auVar16,auVar13);
        this_00 = pAVar6;
        if (dVar14 * 2.220446049250313e-15 < auVar2._0_8_) break;
        if (auVar15._0_8_ <= dVar14) {
          unaff_RBX = pAVar6->prev_leaf_;
          if (unaff_RBX == (self_type *)0x0) break;
          uVar11 = (ulong)(uint)unaff_RBX->data_capacity_;
          do {
            if ((int)uVar11 < 1) {
              iVar10 = -0x80000000;
              goto LAB_0014280f;
            }
            uVar5 = (int)uVar11 - 1;
            uVar11 = (ulong)uVar5;
          } while ((unaff_RBX->bitmap_[uVar5 >> 6] >> (uVar11 & 0x3f) & 1) == 0);
          iVar10 = unaff_RBX->key_slots_[uVar5];
LAB_0014280f:
          if (iVar10 < iVar4) {
            unaff_RBX = pAVar6;
          }
        }
        else {
          unaff_RBX = pAVar6->next_leaf_;
          if (unaff_RBX ==
              (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
               *)0x0) break;
          iVar10 = 0x7fffffff;
          if (0 < unaff_RBX->data_capacity_) {
            uVar11 = 0;
            do {
              if ((unaff_RBX->bitmap_[uVar11 >> 6 & 0x3ffffff] >> (uVar11 & 0x3f) & 1) != 0) {
                iVar10 = unaff_RBX->key_slots_[uVar11];
                break;
              }
              uVar11 = uVar11 + 1;
            } while (unaff_RBX->data_capacity_ != (int)uVar11);
          }
          if (iVar4 < iVar10) {
            unaff_RBX = pAVar6;
          }
        }
      }
      this_00 = unaff_RBX;
    } while (bVar3 == false);
  }
  uVar5 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
          find_key(this_00,key);
  if ((int)uVar5 < 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = this_00->payload_slots_ + uVar5;
  }
  return piVar7;
}

Assistant:

P* get_payload(const T& key) const {
    stats_.num_lookups++;
    data_node_type* leaf = get_leaf(key);
    int idx = leaf->find_key(key);
    if (idx < 0) {
      return nullptr;
    } else {
      return &(leaf->get_payload(idx));
    }
  }